

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *centre,float radius,float amin,float amax,int num_segments)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec2 local_38;
  float local_30;
  int local_2c;
  float a;
  int i;
  int num_segments_local;
  float amax_local;
  float amin_local;
  float radius_local;
  ImVec2 *centre_local;
  ImDrawList *this_local;
  
  a = (float)num_segments;
  i = (int)amax;
  num_segments_local = (int)amin;
  amax_local = radius;
  _amin_local = centre;
  centre_local = (ImVec2 *)this;
  if ((radius == 0.0) && (!NAN(radius))) {
    ImVector<ImVec2>::push_back(&this->_Path,centre);
  }
  ImVector<ImVec2>::reserve(&this->_Path,(this->_Path).Size + (int)a + 1);
  for (local_2c = 0; local_2c <= (int)a; local_2c = local_2c + 1) {
    local_30 = ((float)local_2c / (float)(int)a) * ((float)i - (float)num_segments_local) +
               (float)num_segments_local;
    fVar1 = _amin_local->x;
    fVar3 = cosf(local_30);
    fVar3 = fVar3 * amax_local;
    fVar2 = _amin_local->y;
    fVar4 = sinf(local_30);
    ImVec2::ImVec2(&local_38,fVar3 + fVar1,fVar4 * amax_local + fVar2);
    ImVector<ImVec2>::push_back(&this->_Path,&local_38);
  }
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& centre, float radius, float amin, float amax, int num_segments)
{
    if (radius == 0.0f)
        _Path.push_back(centre);
    _Path.reserve(_Path.Size + (num_segments + 1));
    for (int i = 0; i <= num_segments; i++)
    {
        const float a = amin + ((float)i / (float)num_segments) * (amax - amin);
        _Path.push_back(ImVec2(centre.x + cosf(a) * radius, centre.y + sinf(a) * radius));
    }
}